

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rga.cpp
# Opt level: O0

MPP_RET rga_dup_field(RgaCtx ctx,MppFrame frame)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  MppFrameFormat fmt_00;
  RgaFormat RVar7;
  undefined8 uVar8;
  RgaReq *request;
  RgaFormat fmt;
  void *ptr;
  RK_S32 fd;
  RK_U32 v_str;
  RK_U32 h_str;
  RK_U32 height;
  RK_U32 width;
  MppBuffer buf;
  RgaCtxImpl *impl;
  MPP_RET ret;
  MppFrame frame_local;
  RgaCtx ctx_local;
  
  uVar8 = mpp_frame_get_buffer(frame);
  iVar1 = mpp_frame_get_width(frame);
  uVar2 = mpp_frame_get_height(frame);
  iVar3 = mpp_frame_get_hor_stride(frame);
  uVar4 = mpp_frame_get_ver_stride(frame);
  iVar5 = mpp_buffer_get_fd_with_caller(uVar8,"rga_dup_field");
  iVar6 = mpp_buffer_get_ptr_with_caller(uVar8);
  fmt_00 = mpp_frame_get_fmt(frame);
  RVar7 = rga_fmt_map(fmt_00);
  if ((rga_debug & 1) != 0) {
    _mpp_log_l(4,0,"in\n");
  }
  if ((RVar7 != RGA_FMT_YCbCr_420_SP) &&
     (_mpp_log_l(2,0,"Assertion %s failed at %s:%d\n",0,"fmt == RGA_FMT_YCbCr_420_SP",
                 "rga_dup_field",0x172), (_mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  if (((iVar1 == 0) || (uVar2 == 0)) &&
     (_mpp_log_l(2,0,"Assertion %s failed at %s:%d\n",0,"width > 0 && height > 0","rga_dup_field",
                 0x173), (_mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  if (((RVar7 == RGA_FMT_YCbCr_420_SP) && (iVar1 != 0)) && (uVar2 != 0)) {
    if ((rga_debug & 2) != 0) {
      _mpp_log_l(4,0,"[fd:w:h:h_str:v_str:fmt] %d:%d:%d:%d:%d:%d\n",0,iVar5,iVar1,uVar2,iVar3,uVar4,
                 10);
    }
    memset((void *)((long)ctx + 8),0,0x128);
    *(long *)((long)ctx + 0x10) = (long)iVar5;
    *(undefined4 *)((long)ctx + 0x28) = 10;
    *(short *)((long)ctx + 0x34) = (short)(iVar3 << 1);
    *(short *)((long)ctx + 0x36) = (short)(uVar4 >> 1);
    *(short *)((long)ctx + 0x2c) = (short)iVar1;
    *(short *)((long)ctx + 0x2e) = (short)(uVar2 >> 1);
    *(undefined8 *)((long)ctx + 0x40) = 0;
    *(ulong *)((long)ctx + 0x48) = (ulong)(uint)(iVar6 + iVar3);
    *(short *)((long)ctx + 100) = (short)(iVar3 << 1);
    *(short *)((long)ctx + 0x66) = (short)(uVar4 >> 1);
    *(undefined4 *)((long)ctx + 0x58) = 10;
    *(short *)((long)ctx + 0x5c) = (short)iVar1;
    *(short *)((long)ctx + 0x5e) = (short)(uVar2 >> 1);
    *(undefined2 *)((long)ctx + 0xb0) = 0;
    *(short *)((long)ctx + 0xb2) = (short)(iVar3 << 1) + -1;
    *(undefined2 *)((long)ctx + 0xb4) = 0;
    *(short *)((long)ctx + 0xb6) = (short)(uVar4 >> 1) + -1;
    *(undefined1 *)((long)ctx + 0x108) = 1;
    *(undefined4 *)((long)ctx + 0x118) = 0x21;
    *(uint *)((long)ctx + 0x118) = *(uint *)((long)ctx + 0x118) | 0x80000500;
    impl._4_4_ = rga_ioctl((RgaCtxImpl *)ctx);
  }
  else {
    impl._4_4_ = MPP_NOK;
  }
  if ((rga_debug & 1) != 0) {
    _mpp_log_l(4,0,"out\n","rga_dup_field");
  }
  return impl._4_4_;
}

Assistant:

MPP_RET rga_dup_field(RgaCtx ctx, MppFrame frame)
{
    MPP_RET ret = MPP_OK;
    RgaCtxImpl *impl = (RgaCtxImpl *)ctx;
    MppBuffer buf = mpp_frame_get_buffer(frame);
    RK_U32 width  = mpp_frame_get_width(frame);
    RK_U32 height = mpp_frame_get_height(frame);
    RK_U32 h_str  = mpp_frame_get_hor_stride(frame);
    RK_U32 v_str  = mpp_frame_get_ver_stride(frame);
    RK_S32 fd = mpp_buffer_get_fd(buf);
    void *ptr = mpp_buffer_get_ptr(buf);
    RgaFormat fmt = rga_fmt_map(mpp_frame_get_fmt(frame));
    RgaReq *request = &impl->request;

    rga_dbg_func("in\n");

    mpp_assert(fmt == RGA_FMT_YCbCr_420_SP);
    mpp_assert(width > 0 && height > 0);
    if (fmt != RGA_FMT_YCbCr_420_SP || width == 0 || height == 0) {
        ret = MPP_NOK;
        goto END;
    }

    rga_dbg_dup("[fd:w:h:h_str:v_str:fmt] %d:%d:%d:%d:%d:%d\n",
                fd, width, height, h_str, v_str, fmt);

    memset(request, 0, sizeof(*request));
    request->src.yrgb_addr = fd;
    request->src.format = (RK_U32)fmt;
    request->src.vir_w = h_str * 2;
    request->src.vir_h = v_str / 2;
    request->src.act_w = width;
    request->src.act_h = height / 2;

    request->dst.yrgb_addr = 0;
    request->dst.uv_addr = (RK_U32)((uintptr_t)ptr) + h_str; // special process here
    request->dst.vir_w = h_str * 2;
    request->dst.vir_h = v_str / 2;
    request->dst.format = (RK_U32)fmt;
    request->dst.act_w = width;
    request->dst.act_h = height / 2;

    request->clip.xmin = 0;
    request->clip.xmax = h_str * 2 - 1;
    request->clip.ymin = 0;
    request->clip.ymax = v_str / 2 - 1;

    request->mmu_info.mmu_en = 1;
    request->mmu_info.mmu_flag = ((2 & 0x3) << 4) | 1;
    request->mmu_info.mmu_flag |= (1 << 31) | (1 << 10) | (1 << 8);

    ret = rga_ioctl(impl);
END:
    rga_dbg_func("out\n");
    return ret;
}